

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_parallel.h
# Opt level: O2

void __thiscall
agge::renderer_parallel::operator()
          (renderer_parallel *this,bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,
          rect_i *window,mask_full<8UL> *mask,blender<unsigned_char,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  rendition_adapter adapter;
  kernel_function local_88;
  blender<unsigned_char,_unsigned_char> **local_80;
  renderer_parallel *local_78;
  mask_full<8UL> *local_70;
  simple_alpha<unsigned_char,_8UL> *local_68;
  blender<unsigned_char,_unsigned_char> *local_60;
  vector_i local_58;
  rect_i local_50;
  bitmap<unsigned_char,_0UL,_0UL> *local_38;
  
  local_60 = blender;
  local_58 = offset;
  local_50 = renderer::
             adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
             ::make_window(bitmap_,offset,window);
  local_88._vptr_kernel_function = (_func_int **)&PTR_operator___001d4f18;
  local_68 = alpha;
  local_80 = &local_60;
  local_78 = this;
  local_70 = mask;
  local_38 = bitmap_;
  parallel::call(&this->_parallel,&local_88);
  return;
}

Assistant:

void renderer_parallel::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window,
		const MaskT &mask, const BlenderT &blender, const AlphaFn &alpha)
	{
		typedef renderer::adapter<BitmapT, BlenderT> rendition_adapter;

		struct kernel_function : parallel::kernel_function, noncopyable
		{
			kernel_function(const rendition_adapter &adapter_, const renderer_parallel &renderer_, const MaskT &mask_,
					const AlphaFn &alpha_)
				: adapter(adapter_), renderer(renderer_), mask(mask_), alpha(alpha_)
			{	}

			virtual void operator ()(count_t threadid)
			{
				rendition_adapter ra_thread(adapter);
				scanline_adapter<rendition_adapter> sl(ra_thread, renderer._scanline_caches[threadid], mask.width());

				render(sl, mask, alpha, threadid, renderer._parallelism);
			}

			const rendition_adapter &adapter;
			const renderer_parallel &renderer;
			const MaskT &mask;
			const AlphaFn &alpha;
		};

		const rendition_adapter adapter(bitmap_, offset, window, blender);
		kernel_function kernel(adapter, *this, mask, alpha);

		_parallel.call(kernel);
	}